

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flFTP.cpp
# Opt level: O1

socket_t Rainbow::connectsock(string *host,string *service,string *transport)

{
  sockaddr *psVar1;
  char *__nptr;
  ushort uVar2;
  int iVar3;
  int iVar4;
  servent *psVar5;
  int *piVar6;
  long lVar7;
  protoent *ppVar8;
  undefined8 uVar9;
  socket_t sVar10;
  socket_t sVar11;
  sockaddr_in sin;
  addrinfo *pAip;
  sockaddr local_88;
  addrinfo *local_78;
  char *local_70;
  addrinfo local_68;
  
  local_68.ai_flags = 2;
  local_68.ai_family = 2;
  local_68.ai_socktype = 0;
  local_68.ai_protocol = 0;
  local_68.ai_addrlen = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  iVar3 = getaddrinfo((host->_M_dataplus)._M_p,(char *)0x0,&local_68,&local_78);
  sVar10 = -1;
  sVar11 = sVar10;
  if (iVar3 == 0) {
    if (local_78 != (addrinfo *)0x0) {
      psVar1 = local_78->ai_addr;
      local_88.sa_family = psVar1->sa_family;
      local_88.sa_data[0] = psVar1->sa_data[0];
      local_88.sa_data[1] = psVar1->sa_data[1];
      local_88.sa_data[2] = psVar1->sa_data[2];
      local_88.sa_data[3] = psVar1->sa_data[3];
      local_88.sa_data[4] = psVar1->sa_data[4];
      local_88.sa_data[5] = psVar1->sa_data[5];
      local_88.sa_data._6_8_ = *(undefined8 *)(psVar1->sa_data + 6);
      freeaddrinfo(local_78);
    }
    psVar5 = getservbyname((service->_M_dataplus)._M_p,(transport->_M_dataplus)._M_p);
    if (psVar5 == (servent *)0x0) {
      __nptr = (service->_M_dataplus)._M_p;
      piVar6 = __errno_location();
      iVar3 = *piVar6;
      *piVar6 = 0;
      lVar7 = strtol(__nptr,&local_70,10);
      if (local_70 == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_00112cdf:
        uVar9 = std::__throw_out_of_range("stoi");
        if (*piVar6 == 0) {
          *piVar6 = iVar3;
        }
        _Unwind_Resume(uVar9);
      }
      if (((int)lVar7 != lVar7) || (*piVar6 == 0x22)) goto LAB_00112cdf;
      if (*piVar6 == 0) {
        *piVar6 = iVar3;
      }
      uVar2 = (ushort)lVar7;
      local_88.sa_data._0_2_ = uVar2 << 8 | uVar2 >> 8;
      if (uVar2 == 0) {
        return -1;
      }
    }
    else {
      local_88.sa_data._0_2_ = (short)psVar5->s_port;
    }
    ppVar8 = getprotobyname((transport->_M_dataplus)._M_p);
    if (ppVar8 != (protoent *)0x0) {
      iVar3 = strcasecmp(ppVar8->p_name,"tcp");
      iVar3 = socket(2,2 - (uint)(iVar3 == 0),ppVar8->p_proto);
      if ((iVar3 != -1) && (iVar4 = connect(iVar3,&local_88,0x10), sVar11 = iVar3, iVar4 == -1)) {
        close(iVar3);
        sVar11 = sVar10;
      }
    }
  }
  return sVar11;
}

Assistant:

socket_t connectsock(const std::string &host,
					const std::string &service,
					const std::string &transport)
	{
		struct   sockaddr_in	sin;

#ifdef _WIN32 
		struct   hostent		*pHost;
		struct   servent		*pServen;
		struct   protoent		*pProtocol;

		if(pHost = gethostbyname(host.c_str()))
			memcpy(&sin.sin_addr, pHost->h_addr, pHost->h_length);
		else if((sin.sin_addr.s_addr = inet_addr(host.c_str())) == INADDR_NONE)
			return INVALID_SOCKET;

#endif
#ifdef __linux__ 
		struct   addrinfo		*pAip;
		struct   addrinfo        hint;
		struct	 servent		*pServen;
		struct   protoent		*pProtocol;

		hint.ai_flags = AI_CANONNAME;
		hint.ai_family = AF_INET;
		hint.ai_socktype = 0;
		hint.ai_protocol = 0;
		hint.ai_addrlen = 0;
		hint.ai_canonname = NULL;
		hint.ai_addr = NULL;
		hint.ai_next = NULL;

		if(getaddrinfo(host.c_str(), NULL, &hint, &pAip) != 0)
			return INVALID_SOCKET;
		if(pAip)
		{
			memcpy(&sin, (struct sockaddr_in *)pAip->ai_addr, sizeof(sin));
			freeaddrinfo(pAip);
		}

#endif
		socket_t sd;
		int type;

		if((pServen = getservbyname(service.c_str(), transport.c_str())) != 0)
			sin.sin_port = pServen->s_port;
		else if((sin.sin_port = htons((u_short)std::stoi(service))) == 0)
			return INVALID_SOCKET;

		if((pProtocol = getprotobyname(transport.c_str())) == 0)
			return INVALID_SOCKET;

		if(strcasecmp(pProtocol->p_name, "tcp") == 0)
			type = SOCK_STREAM;
		else
			type = SOCK_DGRAM;

		sd = socket(AF_INET, type, pProtocol->p_proto);
		if(sd == INVALID_SOCKET)
			return INVALID_SOCKET;
		
		if(connect(sd, (sockaddr *)&sin, sizeof(sin)) == SOCKET_ERROR)
		{
			closesocket(sd);
			return INVALID_SOCKET;
		}

		return sd;
	}